

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImVec2 *pIVar1;
  ImGuiNavLayer IVar2;
  ImGuiContext *pIVar3;
  ImRect IVar4;
  
  pIVar3 = GImGui;
  if (GImGui->NavWindow != window) {
    SetNavWindow(window);
  }
  IVar2 = (window->DC).NavLayerCurrent;
  pIVar3->NavId = id;
  pIVar3->NavLayer = IVar2;
  SetNavFocusScope(pIVar3->CurrentFocusScopeId);
  window->NavLastIds[IVar2] = id;
  if ((pIVar3->LastItemData).ID == id) {
    IVar4 = WindowRectAbsToRel(window,&(pIVar3->LastItemData).NavRect);
    window->NavRectRel[IVar2] = IVar4;
  }
  if ((pIVar3->ActiveIdSource & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) {
    pIVar3->NavDisableMouseHover = true;
  }
  else {
    pIVar3->NavDisableHighlight = true;
  }
  pIVar1 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
  pIVar1->x = 3.4028235e+38;
  pIVar1->y = 3.4028235e+38;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (g.NavWindow != window)
       SetNavWindow(window);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and g.CurrentFocusScopeId are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    g.NavId = id;
    g.NavLayer = nav_layer;
    SetNavFocusScope(g.CurrentFocusScopeId);
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;

    // Clear preferred scoring position (NavMoveRequestApplyResult() will tend to restore it)
    NavClearPreferredPosForAxis(ImGuiAxis_X);
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
}